

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void musig_tweak_test_helper
               (secp256k1_xonly_pubkey *agg_pk,uchar *sk0,uchar *sk1,
               secp256k1_musig_keyagg_cache *keyagg_cache)

{
  secp256k1_pubkey *pk_00;
  int iVar1;
  undefined8 uVar2;
  uchar (*b32) [32];
  long lVar3;
  char *pcVar4;
  secp256k1_musig_pubnonce *psVar5;
  secp256k1_musig_partial_sig *psVar6;
  secp256k1_musig_partial_sig *partial_sig_ptr [2];
  secp256k1_musig_pubnonce *pubnonce_ptr [2];
  uchar msg [32];
  secp256k1_musig_partial_sig partial_sig [2];
  uchar session_secrand [2] [32];
  secp256k1_musig_session session;
  uchar final_sig [64];
  secp256k1_pubkey pk [2];
  secp256k1_keypair keypair [2];
  secp256k1_musig_aggnonce aggnonce;
  secp256k1_musig_pubnonce pubnonce [2];
  secp256k1_musig_secnonce secnonce [2];
  
  b32 = session_secrand;
  psVar6 = partial_sig;
  psVar5 = pubnonce;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    pubnonce_ptr[lVar3] = psVar5;
    partial_sig_ptr[lVar3] = psVar6;
    testrand256(*b32);
    b32 = b32 + 1;
    psVar6 = psVar6 + 1;
    psVar5 = psVar5 + 1;
  }
  iVar1 = create_keypair_and_pk(keypair,pk,sk0);
  if (iVar1 == 0) {
    pcVar4 = "test condition failed: create_keypair_and_pk(&keypair[0], &pk[0], sk0) == 1";
    uVar2 = 0x263;
  }
  else {
    pk_00 = pk + 1;
    iVar1 = create_keypair_and_pk(keypair + 1,pk_00,sk1);
    if (iVar1 == 0) {
      pcVar4 = "test condition failed: create_keypair_and_pk(&keypair[1], &pk[1], sk1) == 1";
      uVar2 = 0x264;
    }
    else {
      testrand256(msg);
      iVar1 = secp256k1_musig_nonce_gen
                        (CTX,secnonce,pubnonce,session_secrand[0],sk0,pk,(uchar *)0x0,
                         (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
      if (iVar1 == 1) {
        iVar1 = secp256k1_musig_nonce_gen
                          (CTX,secnonce + 1,pubnonce + 1,session_secrand[1],sk1,pk_00,(uchar *)0x0,
                           (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
        if (iVar1 == 1) {
          iVar1 = secp256k1_musig_nonce_agg(CTX,&aggnonce,pubnonce_ptr,2);
          if (iVar1 == 0) {
            pcVar4 = 
            "test condition failed: secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2) == 1"
            ;
            uVar2 = 0x26a;
          }
          else {
            iVar1 = secp256k1_musig_nonce_process(CTX,&session,&aggnonce,msg,keyagg_cache);
            if (iVar1 == 0) {
              pcVar4 = 
              "test condition failed: secp256k1_musig_nonce_process(CTX, &session, &aggnonce, msg, keyagg_cache) == 1"
              ;
              uVar2 = 0x26b;
            }
            else {
              iVar1 = secp256k1_musig_partial_sign
                                (CTX,partial_sig,secnonce,keypair,keyagg_cache,&session);
              if (iVar1 == 0) {
                pcVar4 = 
                "test condition failed: secp256k1_musig_partial_sign(CTX, &partial_sig[0], &secnonce[0], &keypair[0], keyagg_cache, &session) == 1"
                ;
                uVar2 = 0x26d;
              }
              else {
                iVar1 = secp256k1_musig_partial_sign
                                  (CTX,partial_sig + 1,secnonce + 1,keypair + 1,keyagg_cache,
                                   &session);
                if (iVar1 == 0) {
                  pcVar4 = 
                  "test condition failed: secp256k1_musig_partial_sign(CTX, &partial_sig[1], &secnonce[1], &keypair[1], keyagg_cache, &session) == 1"
                  ;
                  uVar2 = 0x26e;
                }
                else {
                  iVar1 = secp256k1_musig_partial_sig_verify
                                    (CTX,partial_sig,pubnonce,pk,keyagg_cache,&session);
                  if (iVar1 == 1) {
                    iVar1 = secp256k1_musig_partial_sig_verify
                                      (CTX,partial_sig + 1,pubnonce + 1,pk_00,keyagg_cache,&session)
                    ;
                    if (iVar1 == 1) {
                      iVar1 = secp256k1_musig_partial_sig_agg
                                        (CTX,final_sig,&session,partial_sig_ptr,2);
                      if (iVar1 == 1) {
                        iVar1 = secp256k1_schnorrsig_verify(CTX,final_sig,msg,0x20,agg_pk);
                        if (iVar1 != 0) {
                          return;
                        }
                        pcVar4 = 
                        "test condition failed: secp256k1_schnorrsig_verify(CTX, final_sig, msg, sizeof(msg), agg_pk) == 1"
                        ;
                        uVar2 = 0x274;
                      }
                      else {
                        pcVar4 = 
                        "test condition failed: secp256k1_musig_partial_sig_agg(CTX, final_sig, &session, partial_sig_ptr, 2) == 1"
                        ;
                        uVar2 = 0x273;
                      }
                    }
                    else {
                      pcVar4 = 
                      "test condition failed: secp256k1_musig_partial_sig_verify(CTX, &partial_sig[1], &pubnonce[1], &pk[1], keyagg_cache, &session) == 1"
                      ;
                      uVar2 = 0x271;
                    }
                  }
                  else {
                    pcVar4 = 
                    "test condition failed: secp256k1_musig_partial_sig_verify(CTX, &partial_sig[0], &pubnonce[0], &pk[0], keyagg_cache, &session) == 1"
                    ;
                    uVar2 = 0x270;
                  }
                }
              }
            }
          }
        }
        else {
          pcVar4 = 
          "test condition failed: secp256k1_musig_nonce_gen(CTX, &secnonce[1], &pubnonce[1], session_secrand[1], sk1, &pk[1], NULL, NULL, NULL) == 1"
          ;
          uVar2 = 0x268;
        }
      }
      else {
        pcVar4 = 
        "test condition failed: secp256k1_musig_nonce_gen(CTX, &secnonce[0], &pubnonce[0], session_secrand[0], sk0, &pk[0], NULL, NULL, NULL) == 1"
        ;
        uVar2 = 0x267;
      }
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

static void musig_tweak_test_helper(const secp256k1_xonly_pubkey* agg_pk, const unsigned char *sk0, const unsigned char *sk1, secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_pubkey pk[2];
    unsigned char session_secrand[2][32];
    unsigned char msg[32];
    secp256k1_musig_secnonce secnonce[2];
    secp256k1_musig_pubnonce pubnonce[2];
    const secp256k1_musig_pubnonce *pubnonce_ptr[2];
    secp256k1_musig_aggnonce aggnonce;
    secp256k1_keypair keypair[2];
    secp256k1_musig_session session;
    secp256k1_musig_partial_sig partial_sig[2];
    const secp256k1_musig_partial_sig *partial_sig_ptr[2];
    unsigned char final_sig[64];
    int i;

    for (i = 0; i < 2; i++) {
        pubnonce_ptr[i] = &pubnonce[i];
        partial_sig_ptr[i] = &partial_sig[i];

        testrand256(session_secrand[i]);
    }
    CHECK(create_keypair_and_pk(&keypair[0], &pk[0], sk0) == 1);
    CHECK(create_keypair_and_pk(&keypair[1], &pk[1], sk1) == 1);
    testrand256(msg);

    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[0], &pubnonce[0], session_secrand[0], sk0, &pk[0], NULL, NULL, NULL) == 1);
    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[1], &pubnonce[1], session_secrand[1], sk1, &pk[1], NULL, NULL, NULL) == 1);

    CHECK(secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2) == 1);
    CHECK(secp256k1_musig_nonce_process(CTX, &session, &aggnonce, msg, keyagg_cache) == 1);

    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[0], &secnonce[0], &keypair[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[1], &secnonce[1], &keypair[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[0], &pubnonce[0], &pk[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[1], &pubnonce[1], &pk[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_agg(CTX, final_sig, &session, partial_sig_ptr, 2) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, final_sig, msg, sizeof(msg), agg_pk) == 1);
}